

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O3

DS_STATUS ds_list_remove_last(DsList *list,void **pdata)

{
  DsListEntry *pDVar1;
  DsList *pDVar2;
  DS_STATUS DVar3;
  DsListEntry *pDVar4;
  DsList *entryAdd;
  
  if ((list != (DsList *)0x0) &&
     (pDVar1 = list->entry, pDVar2 = list, list->entry != (DsListEntry *)0x0)) {
    do {
      entryAdd = pDVar2;
      pDVar4 = pDVar1;
      pDVar1 = pDVar4->next;
      pDVar2 = (DsList *)&pDVar4->next;
    } while (pDVar4->next != (DsListEntry *)0x0);
    if (pdata != (void **)0x0) {
      *pdata = pDVar4->data;
    }
    list->size = list->size - 1;
    DVar3 = ds_entry_remove(&entryAdd->entry);
    return DVar3;
  }
  return DS_STATUS_NULL;
}

Assistant:

DS_STATUS ds_list_remove_last(DsList *list, void **pdata)
{
    if (NULL == list || NULL == list->entry)
        return DS_STATUS_NULL;

    DsListEntry **entry = &list->entry;
    while ((*entry)->next)
        entry = &(*entry)->next;

    if (NULL != pdata)
        *pdata = (*entry)->data;
    (list->size)--;
    return ds_entry_remove(entry);
}